

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf_tests.cpp
# Opt level: O0

void __thiscall rbf_tests::feerate_chunks_utilities::test_method(feerate_chunks_utilities *this)

{
  long lVar1;
  initializer_list<FeeFrac> __l;
  initializer_list<FeeFrac> __l_00;
  initializer_list<FeeFrac> __l_01;
  initializer_list<FeeFrac> __l_02;
  initializer_list<FeeFrac> __l_03;
  initializer_list<FeeFrac> __l_04;
  initializer_list<FeeFrac> __l_05;
  initializer_list<FeeFrac> __l_06;
  initializer_list<FeeFrac> __l_07;
  initializer_list<FeeFrac> __l_08;
  initializer_list<FeeFrac> __l_09;
  initializer_list<FeeFrac> __l_10;
  initializer_list<FeeFrac> __l_11;
  initializer_list<FeeFrac> __l_12;
  initializer_list<FeeFrac> __l_13;
  initializer_list<FeeFrac> __l_14;
  initializer_list<FeeFrac> __l_15;
  initializer_list<FeeFrac> __l_16;
  initializer_list<FeeFrac> __l_17;
  Span<const_FeeFrac> chunks1;
  Span<const_FeeFrac> chunks1_00;
  Span<const_FeeFrac> chunks1_01;
  Span<const_FeeFrac> chunks1_02;
  Span<const_FeeFrac> chunks1_03;
  Span<const_FeeFrac> chunks1_04;
  Span<const_FeeFrac> chunks1_05;
  Span<const_FeeFrac> chunks1_06;
  Span<const_FeeFrac> chunks1_07;
  Span<const_FeeFrac> chunks1_08;
  Span<const_FeeFrac> chunks1_09;
  Span<const_FeeFrac> chunks1_10;
  Span<const_FeeFrac> chunks1_11;
  Span<const_FeeFrac> chunks1_12;
  Span<const_FeeFrac> chunks1_13;
  Span<const_FeeFrac> chunks1_14;
  Span<const_FeeFrac> chunks1_15;
  Span<const_FeeFrac> chunks1_16;
  Span<const_FeeFrac> chunks1_17;
  Span<const_FeeFrac> chunks1_18;
  Span<const_FeeFrac> chunks0;
  Span<const_FeeFrac> chunks0_00;
  Span<const_FeeFrac> chunks0_01;
  Span<const_FeeFrac> chunks0_02;
  Span<const_FeeFrac> chunks0_03;
  Span<const_FeeFrac> chunks0_04;
  Span<const_FeeFrac> chunks0_05;
  Span<const_FeeFrac> chunks0_06;
  Span<const_FeeFrac> chunks0_07;
  Span<const_FeeFrac> chunks0_08;
  Span<const_FeeFrac> chunks0_09;
  Span<const_FeeFrac> chunks0_10;
  Span<const_FeeFrac> chunks0_11;
  Span<const_FeeFrac> chunks0_12;
  Span<const_FeeFrac> chunks0_13;
  Span<const_FeeFrac> chunks0_14;
  Span<const_FeeFrac> chunks0_15;
  Span<const_FeeFrac> chunks0_16;
  Span<const_FeeFrac> chunks0_17;
  Span<const_FeeFrac> chunks0_18;
  bool bVar2;
  long in_FS_OFFSET;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_ffffffffffffebe8;
  undefined7 in_stack_ffffffffffffebf0;
  undefined1 in_stack_ffffffffffffebf7;
  assertion_result *in_stack_ffffffffffffebf8;
  vector<FeeFrac,_std::allocator<FeeFrac>_> *in_stack_ffffffffffffec08;
  undefined7 in_stack_ffffffffffffec10;
  partial_ordering in_stack_ffffffffffffec17;
  size_type in_stack_ffffffffffffec18;
  size_t line_num;
  undefined7 in_stack_ffffffffffffec20;
  undefined1 in_stack_ffffffffffffec27;
  lazy_ostream *in_stack_ffffffffffffec28;
  undefined7 in_stack_ffffffffffffec30;
  undefined1 in_stack_ffffffffffffec37;
  size_type in_stack_ffffffffffffec38;
  lazy_ostream *in_stack_ffffffffffffed10;
  undefined7 in_stack_ffffffffffffed18;
  partial_ordering in_stack_ffffffffffffed1f;
  undefined8 in_stack_ffffffffffffed20;
  size_t sVar3;
  undefined7 in_stack_ffffffffffffed28;
  undefined1 in_stack_ffffffffffffed2f;
  feerate_chunks_utilities *this_local;
  const_string local_f18 [2];
  lazy_ostream local_ef8 [2];
  undefined1 local_ed1;
  assertion_result local_eb0 [2];
  const_string local_e78 [2];
  lazy_ostream local_e58 [2];
  undefined1 local_e31;
  assertion_result local_e10 [2];
  const_string local_dd8 [2];
  lazy_ostream local_db8 [4];
  assertion_result local_d78 [2];
  const_string local_d40 [2];
  lazy_ostream local_d20 [4];
  assertion_result local_ce0 [2];
  const_string local_ca8 [2];
  lazy_ostream local_c88 [4];
  assertion_result local_c48 [2];
  const_string local_c10 [2];
  lazy_ostream local_bf0 [4];
  assertion_result local_bb0 [2];
  const_string local_b78 [2];
  lazy_ostream local_b58 [4];
  assertion_result local_b18 [2];
  const_string local_ae0 [2];
  lazy_ostream local_ac0 [4];
  assertion_result local_a80 [2];
  const_string local_a48 [2];
  lazy_ostream local_a28 [4];
  assertion_result local_9e8 [2];
  const_string local_9b0 [2];
  lazy_ostream local_990 [4];
  assertion_result local_950 [2];
  const_string local_918 [2];
  lazy_ostream local_8f8 [2];
  undefined1 local_8d1;
  assertion_result local_8b0 [2];
  const_string local_878 [2];
  lazy_ostream local_858 [2];
  undefined1 local_831;
  assertion_result local_810 [2];
  const_string local_7d8 [2];
  lazy_ostream local_7b8 [4];
  assertion_result local_778 [2];
  const_string local_740 [2];
  lazy_ostream local_720 [4];
  assertion_result local_6e0 [2];
  const_string local_6a8 [2];
  lazy_ostream local_688 [4];
  assertion_result local_648 [2];
  const_string local_610 [2];
  lazy_ostream local_5f0 [4];
  assertion_result local_5b0 [2];
  const_string local_578 [2];
  lazy_ostream local_558 [2];
  undefined1 local_531;
  assertion_result local_510 [2];
  const_string local_4d8 [2];
  lazy_ostream local_4b8 [2];
  undefined1 local_491;
  assertion_result local_470 [2];
  const_string local_438 [2];
  lazy_ostream local_418 [4];
  assertion_result local_3d8 [2];
  const_string local_3a0 [2];
  lazy_ostream local_380 [4];
  assertion_result local_340 [2];
  vector<FeeFrac,_std::allocator<FeeFrac>_> new_chunks;
  vector<FeeFrac,_std::allocator<FeeFrac>_> old_chunks;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  std::allocator<FeeFrac>::allocator((allocator<FeeFrac> *)in_stack_ffffffffffffebe8);
  __l_16._M_array._7_1_ = in_stack_ffffffffffffec37;
  __l_16._M_array._0_7_ = in_stack_ffffffffffffec30;
  __l_16._M_len = in_stack_ffffffffffffec38;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::vector
            ((vector<FeeFrac,_std::allocator<FeeFrac>_> *)in_stack_ffffffffffffec28,__l_16,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
  std::allocator<FeeFrac>::~allocator((allocator<FeeFrac> *)in_stack_ffffffffffffebe8);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  std::allocator<FeeFrac>::allocator((allocator<FeeFrac> *)in_stack_ffffffffffffebe8);
  __l_17._M_array._7_1_ = in_stack_ffffffffffffec37;
  __l_17._M_array._0_7_ = in_stack_ffffffffffffec30;
  __l_17._M_len = in_stack_ffffffffffffec38;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::vector
            ((vector<FeeFrac,_std::allocator<FeeFrac>_> *)in_stack_ffffffffffffec28,__l_17,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
  std::allocator<FeeFrac>::~allocator((allocator<FeeFrac> *)in_stack_ffffffffffffebe8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0,chunks1);
    std::is_lt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_340,local_380,local_3a0,0x22e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_00.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_00.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_00.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_00.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_00.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_00.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_00,chunks1_00);
    std::is_gt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3d8,local_418,local_438,0x22f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_00._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_00._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_00._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_01.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_01.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_01.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_01.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_01.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_01.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_01,chunks1_01);
    local_491 = 2;
    std::operator==((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38),
                    (partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x30));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_470,local_4b8,local_4d8,0x235,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_02.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_02.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_02.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_02.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_02.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_02.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_02,chunks1_02);
    local_531 = 2;
    std::operator==((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38),
                    (partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x30));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_510,local_558,local_578,0x236,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_01._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_01._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_01._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_01);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_02._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_02._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_02._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_02);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_03.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_03.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_03.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_03.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_03.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_03.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_03,chunks1_03);
    std::is_lt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5b0,local_5f0,local_610,0x23c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_04.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_04.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_04.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_04.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_04.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_04.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_04,chunks1_04);
    std::is_gt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_648,local_688,local_6a8,0x23d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_03._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_03._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_03._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_03);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_04._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_04._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_04._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_04);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_05.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_05.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_05.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_05.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_05.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_05.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_05,chunks1_05);
    std::is_lt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6e0,local_720,local_740,0x244,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_06.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_06.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_06.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_06.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_06.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_06.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_06,chunks1_06);
    std::is_gt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_778,local_7b8,local_7d8,0x245,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_05._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_05._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_05._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_05);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_06._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_06._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_06._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_06);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_07.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_07.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_07.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_07.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_07.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_07.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_07,chunks1_07);
    local_831 = 2;
    std::operator==((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38),
                    (partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x30));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_810,local_858,local_878,0x24b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_08.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_08.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_08.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_08.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_08.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_08.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_08,chunks1_08);
    local_8d1 = 2;
    std::operator==((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38),
                    (partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x30));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8b0,local_8f8,local_918,0x24c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_07._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_07._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_07._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_07);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_08._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_08._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_08._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_08);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_09.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_09.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_09.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_09.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_09.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_09.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_09,chunks1_09);
    std::is_lt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_950,local_990,local_9b0,0x252,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_10.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_10.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_10.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_10.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_10.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_10.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_10,chunks1_10);
    std::is_gt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9e8,local_a28,local_a48,0x253,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_09._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_09._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_09._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_09);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_10._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_10._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_10._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_10);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_11.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_11.m_data = (FeeFrac *)in_stack_ffffffffffffed20;
    chunks0_11.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_11.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_11.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_11.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_11,chunks1_11);
    std::is_eq((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a80,local_ac0,local_ae0,0x259,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffed2f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffed2f);
  do {
    sVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_12.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_12.m_data = (FeeFrac *)sVar3;
    chunks0_12.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_12.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_12.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_12.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    in_stack_ffffffffffffed1f = CompareChunks(chunks0_12,chunks1_12);
    std::is_eq((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    in_stack_ffffffffffffed10 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b18,local_b58,local_b78,0x25a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_11._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_11._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_11._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_11);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_12._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_12._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_12._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_12);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_13.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_13.m_data = (FeeFrac *)sVar3;
    chunks0_13.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_13.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_13.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_13.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_13,chunks1_13);
    std::is_gt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_bb0,local_bf0,local_c10,0x261,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_14.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_14.m_data = (FeeFrac *)sVar3;
    chunks0_14.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_14.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_14.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_14.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_14,chunks1_14);
    std::is_lt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c48,local_c88,local_ca8,0x262,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_13._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_13._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_13._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_13);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_14._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_14._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_14._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_14);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_15.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_15.m_data = (FeeFrac *)sVar3;
    chunks0_15.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_15.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_15.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_15.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_15,chunks1_15);
    std::is_gt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ce0,local_d20,local_d40,0x268,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_16.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_16.m_data = (FeeFrac *)sVar3;
    chunks0_16.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_16.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_16.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_16.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_16,chunks1_16);
    std::is_lt((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d78,local_db8,local_dd8,0x269,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  FeeFrac::FeeFrac((FeeFrac *)in_stack_ffffffffffffebf8,
                   CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                   (int32_t)((ulong)in_stack_ffffffffffffebe8 >> 0x20));
  __l_15._M_array._7_1_ = in_stack_ffffffffffffec17._M_value;
  __l_15._M_array._0_7_ = in_stack_ffffffffffffec10;
  __l_15._M_len = in_stack_ffffffffffffec18;
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::operator=(in_stack_ffffffffffffec08,__l_15);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_17.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_17.m_data = (FeeFrac *)sVar3;
    chunks0_17.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_17.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_17.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_17.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    CompareChunks(chunks0_17,chunks1_17);
    local_e31 = 2;
    std::operator==((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38),
                    (partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x30));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    in_stack_ffffffffffffec28 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e10,local_e58,local_e78,0x26d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffec27 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffec27);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               line_num,(const_string *)
                        CONCAT17(in_stack_ffffffffffffec17._M_value,in_stack_ffffffffffffec10));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)in_stack_ffffffffffffebf8,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               in_stack_ffffffffffffebe8);
    chunks0_18.m_size._0_7_ = in_stack_ffffffffffffed28;
    chunks0_18.m_data = (FeeFrac *)sVar3;
    chunks0_18.m_size._7_1_ = in_stack_ffffffffffffed2f;
    chunks1_18.m_size._0_7_ = in_stack_ffffffffffffed18;
    chunks1_18.m_data = (FeeFrac *)in_stack_ffffffffffffed10;
    chunks1_18.m_size._7_1_ = in_stack_ffffffffffffed1f._M_value;
    in_stack_ffffffffffffec17 = CompareChunks(chunks0_18,chunks1_18);
    local_ed1 = 2;
    std::operator==((partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x38),
                    (partial_ordering)(type)((ulong)in_stack_ffffffffffffebe8 >> 0x30));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffebf8,(bool)in_stack_ffffffffffffebf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebe8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8,
               (pointer)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (unsigned_long)in_stack_ffffffffffffebe8);
    in_stack_ffffffffffffebe8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_eb0,local_ef8,local_f18,0x26e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffebe8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebe8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::~vector
            ((vector<FeeFrac,_std::allocator<FeeFrac>_> *)in_stack_ffffffffffffebf8);
  std::vector<FeeFrac,_std::allocator<FeeFrac>_>::~vector
            ((vector<FeeFrac,_std::allocator<FeeFrac>_> *)in_stack_ffffffffffffebf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(feerate_chunks_utilities)
{
    // Sanity check the correctness of the feerate chunks comparison.

    // A strictly better case.
    std::vector<FeeFrac> old_chunks{{{950, 300}, {100, 100}}};
    std::vector<FeeFrac> new_chunks{{{1000, 300}, {50, 100}}};

    BOOST_CHECK(std::is_lt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_gt(CompareChunks(new_chunks, old_chunks)));

    // Incomparable diagrams
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{1000, 300}, {0, 100}};

    BOOST_CHECK(CompareChunks(old_chunks, new_chunks) == std::partial_ordering::unordered);
    BOOST_CHECK(CompareChunks(new_chunks, old_chunks) == std::partial_ordering::unordered);

    // Strictly better but smaller size.
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{1100, 300}};

    BOOST_CHECK(std::is_lt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_gt(CompareChunks(new_chunks, old_chunks)));

    // New diagram is strictly better due to the first chunk, even though
    // second chunk contributes no fees
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{1100, 100}, {0, 100}};

    BOOST_CHECK(std::is_lt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_gt(CompareChunks(new_chunks, old_chunks)));

    // Feerate of first new chunk is better with, but second chunk is worse
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{750, 100}, {249, 250}, {151, 650}};

    BOOST_CHECK(CompareChunks(old_chunks, new_chunks) == std::partial_ordering::unordered);
    BOOST_CHECK(CompareChunks(new_chunks, old_chunks) == std::partial_ordering::unordered);

    // If we make the second chunk slightly better, the new diagram now wins.
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{750, 100}, {250, 250}, {150, 150}};

    BOOST_CHECK(std::is_lt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_gt(CompareChunks(new_chunks, old_chunks)));

    // Identical diagrams, cannot be strictly better
    old_chunks = {{950, 300}, {100, 100}};
    new_chunks = {{950, 300}, {100, 100}};

    BOOST_CHECK(std::is_eq(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_eq(CompareChunks(new_chunks, old_chunks)));

    // Same aggregate fee, but different total size (trigger single tail fee check step)
    old_chunks = {{950, 300}, {100, 99}};
    new_chunks = {{950, 300}, {100, 100}};

    // No change in evaluation when tail check needed.
    BOOST_CHECK(std::is_gt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_lt(CompareChunks(new_chunks, old_chunks)));

    // Trigger multiple tail fee check steps
    old_chunks = {{950, 300}, {100, 99}};
    new_chunks = {{950, 300}, {100, 100}, {0, 1}, {0, 1}};

    BOOST_CHECK(std::is_gt(CompareChunks(old_chunks, new_chunks)));
    BOOST_CHECK(std::is_lt(CompareChunks(new_chunks, old_chunks)));

    // Multiple tail fee check steps, unordered result
    new_chunks = {{950, 300}, {100, 100}, {0, 1}, {0, 1}, {1, 1}};
    BOOST_CHECK(CompareChunks(old_chunks, new_chunks) == std::partial_ordering::unordered);
    BOOST_CHECK(CompareChunks(new_chunks, old_chunks) == std::partial_ordering::unordered);
}